

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O0

void __thiscall SortedRun::do_or(SortedRun *this,SortedRun *other)

{
  iterator __last2;
  iterator this_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last1;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __x;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> new_results;
  SortedRun *in_stack_ffffffffffffff58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff98;
  SortedRun *in_stack_ffffffffffffffa0;
  iterator __first1;
  
  decompress(in_stack_ffffffffffffffa0);
  decompress(in_stack_ffffffffffffffa0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b2b93);
  __last2 = begin(in_stack_ffffffffffffff58);
  end(in_stack_ffffffffffffff58);
  begin(in_stack_ffffffffffffff58);
  this_00 = end(in_stack_ffffffffffffff58);
  __first1 = this_00;
  __last1._M_current =
       (uint *)std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         (&in_stack_ffffffffffffff58->sequence_);
  __x = std::
        set_union<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first1._M_current,__last1,in_stack_ffffffffffffff98,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last2._M_current,in_RDI);
  std::swap<unsigned_int,std::allocator<unsigned_int>>
            (__x.container,&in_stack_ffffffffffffff58->sequence_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_current);
  return;
}

Assistant:

void SortedRun::do_or(SortedRun &other) {
    // In almost every case this is already decompressed.
    decompress();
    other.decompress();
    std::vector<FileId> new_results;
    std::set_union(other.begin(), other.end(), begin(), end(),
                   std::back_inserter(new_results));
    std::swap(new_results, sequence_);
}